

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QByteArray * makeCookieHeader(QList<QNetworkCookie> *cookies,RawForm type,QByteArrayView separator)

{
  QByteArrayView a;
  bool bVar1;
  const_iterator o;
  QNetworkCookie *pQVar2;
  storage_type *in_RSI;
  QList<QNetworkCookie> *in_RDI;
  long in_FS_OFFSET;
  QNetworkCookie *cookie;
  QList<QNetworkCookie> *__range1;
  QByteArray *result;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *in_stack_ffffffffffffff68;
  QList<QNetworkCookie> *this;
  RawForm in_stack_ffffffffffffffbc;
  QNetworkCookie *in_stack_ffffffffffffffc0;
  const_iterator local_20;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x1f5b8d);
  local_20.i = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  local_20 = QList<QNetworkCookie>::begin(this);
  o = QList<QNetworkCookie>::end(this);
  while (bVar1 = QList<QNetworkCookie>::const_iterator::operator!=(&local_20,o), bVar1) {
    pQVar2 = QList<QNetworkCookie>::const_iterator::operator*(&local_20);
    QNetworkCookie::toRawForm(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    QByteArray::operator+=((QByteArray *)this,in_stack_ffffffffffffff68);
    QByteArray::~QByteArray((QByteArray *)0x1f5c48);
    a.m_data = in_RSI;
    a.m_size = (qsizetype)pQVar2;
    QByteArray::operator+=(in_stack_ffffffffffffff68,a);
    QList<QNetworkCookie>::const_iterator::operator++(&local_20);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x1f5c8f);
  if (!bVar1) {
    QByteArrayView::size(&local_18);
    QByteArray::chop((longlong)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

static QByteArray makeCookieHeader(const QList<QNetworkCookie> &cookies,
                                   QNetworkCookie::RawForm type,
                                   QByteArrayView separator)
{
    QByteArray result;
    for (const QNetworkCookie &cookie : cookies) {
        result += cookie.toRawForm(type);
        result += separator;
    }
    if (!result.isEmpty())
        result.chop(separator.size());
    return result;
}